

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_reader.c
# Opt level: O3

char * lafe_line_reader_next(lafe_line_reader *lr)

{
  char *pcVar1;
  size_t sVar2;
  FILE *__stream;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  char *__reject;
  char *pcVar8;
  
  do {
    while( true ) {
      pcVar5 = lr->buff_end;
      pcVar8 = lr->line_end;
      if (pcVar5 <= pcVar8) break;
      pcVar1 = lr->line_start;
      pcVar5 = pcVar8 + 1;
      lr->line_end = pcVar5;
      lr->line_start = pcVar5;
      __reject = "";
      if (lr->nullSeparator == 0) {
        __reject = "\r\n";
      }
      sVar4 = strcspn(pcVar5,__reject);
      lr->line_end = pcVar8 + sVar4 + 1;
      pcVar8[sVar4 + 1] = '\0';
      if (lr->nullSeparator != 0) {
        return pcVar1;
      }
      if (*pcVar1 != '\0') {
        return pcVar1;
      }
    }
    pcVar8 = lr->line_start;
    if (lr->f == (FILE *)0x0) {
      if (pcVar8 == pcVar5) {
        pcVar8 = (char *)0x0;
      }
      else {
        lr->line_start = pcVar5;
      }
      return pcVar8;
    }
    pcVar1 = lr->buff;
    if (pcVar8 <= pcVar1) {
      sVar2 = lr->buff_length;
      if (0 < (long)sVar2) {
        lr->buff_length = sVar2 * 2;
        pcVar5 = (char *)realloc(pcVar1,sVar2 * 2 + 1);
        if (pcVar5 != (char *)0x0) {
          pcVar8 = pcVar5 + ((long)lr->buff_end - (long)lr->buff);
          lr->buff_end = pcVar8;
          lr->line_end = pcVar5 + ((long)lr->line_end - (long)lr->buff);
          lr->buff = pcVar5;
          goto LAB_001103d7;
        }
      }
      pcVar5 = lr->pathname;
      pcVar8 = "Line too long in %s";
      iVar3 = 0xc;
LAB_001104b2:
      lafe_errc(1,iVar3,pcVar8,pcVar5);
    }
    memmove(pcVar1,pcVar8,(long)pcVar5 - (long)pcVar8);
    pcVar5 = lr->buff;
    lVar7 = (long)pcVar5 - (long)lr->line_start;
    pcVar8 = lr->buff_end + lVar7;
    lr->buff_end = pcVar8;
    lr->line_end = lr->line_end + lVar7;
LAB_001103d7:
    lr->line_start = pcVar5;
    sVar4 = fread(pcVar8,1,(size_t)(pcVar5 + (lr->buff_length - (long)pcVar8)),(FILE *)lr->f);
    pcVar5 = lr->buff_end;
    lr->buff_end = pcVar5 + sVar4;
    pcVar5[sVar4] = '\0';
    pcVar5 = lr->line_end;
    pcVar8 = "";
    if (lr->nullSeparator == 0) {
      pcVar8 = "\r\n";
    }
    sVar4 = strcspn(pcVar5,pcVar8);
    lr->line_end = pcVar5 + sVar4;
    pcVar5[sVar4] = '\0';
    __stream = (FILE *)lr->f;
    iVar3 = ferror(__stream);
    if (iVar3 != 0) {
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      pcVar5 = lr->pathname;
      pcVar8 = "Can\'t read %s";
      goto LAB_001104b2;
    }
    iVar3 = feof(__stream);
    if (iVar3 != 0) {
      if ((FILE *)lr->f != _stdin) {
        fclose((FILE *)lr->f);
      }
      lr->f = (FILE *)0x0;
    }
  } while( true );
}

Assistant:

const char *
lafe_line_reader_next(struct lafe_line_reader *lr)
{
	size_t bytes_wanted, bytes_read, new_buff_size;
	char *line_start, *p;

	for (;;) {
		/* If there's a line in the buffer, return it immediately. */
		while (lr->line_end < lr->buff_end) {
			line_start = lr->line_start;
			lr->line_start = ++lr->line_end;
			lafe_line_reader_find_eol(lr);

			if (lr->nullSeparator || line_start[0] != '\0')
				return (line_start);
		}

		/* If we're at end-of-file, process the final data. */
		if (lr->f == NULL) {
			if (lr->line_start == lr->buff_end)
				return (NULL); /* No more text */
			line_start = lr->line_start;
			lr->line_start = lr->buff_end;
			return (line_start);
		}

		/* Buffer only has part of a line. */
		if (lr->line_start > lr->buff) {
			/* Move a leftover fractional line to the beginning. */
			memmove(lr->buff, lr->line_start,
			    lr->buff_end - lr->line_start);
			lr->buff_end -= lr->line_start - lr->buff;
			lr->line_end -= lr->line_start - lr->buff;
			lr->line_start = lr->buff;
		} else {
			/* Line is too big; enlarge the buffer. */
			new_buff_size = lr->buff_length * 2;
			if (new_buff_size <= lr->buff_length)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_length = new_buff_size;
			/*
			 * Allocate one extra byte to allow terminating
			 * the buffer.
			 */
			p = realloc(lr->buff, new_buff_size + 1);
			if (p == NULL)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_end = p + (lr->buff_end - lr->buff);
			lr->line_end = p + (lr->line_end - lr->buff);
			lr->line_start = lr->buff = p;
		}

		/* Get some more data into the buffer. */
		bytes_wanted = lr->buff + lr->buff_length - lr->buff_end;
		bytes_read = fread(lr->buff_end, 1, bytes_wanted, lr->f);
		lr->buff_end += bytes_read;
		*lr->buff_end = '\0'; /* Always terminate buffer */
		lafe_line_reader_find_eol(lr);

		if (ferror(lr->f))
			lafe_errc(1, errno, "Can't read %s", lr->pathname);
		if (feof(lr->f)) {
			if (lr->f != stdin)
				fclose(lr->f);
			lr->f = NULL;
		}
	}
}